

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> * __thiscall
VW::config::typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::value
          (typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *value)

{
  typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *in_stack_ffffffffffffffe0
  ;
  
  std::
  make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
            (in_stack_00000008);
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator=
            (in_stack_ffffffffffffffe0,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)in_RDI);
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0x3f4c80);
  return in_RDI;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }